

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O2

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>::GradX<Fad<double>>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *param,TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *pFVar1;
  TPZFMatrix<Fad<double>_> *vec2;
  int i_1;
  long lVar2;
  int i;
  long lVar3;
  FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
  local_a98;
  Fad<double> zero;
  Fad<double> norm;
  Fad<double> local_a50;
  Fad<double> phi;
  undefined1 local_a10 [144];
  TPZFNMatrix<9,_Fad<double>_> gradv;
  TPZManVector<Fad<double>,_3> xqsiLxc;
  TPZFMatrix<Fad<double>_> local_730;
  TPZFMatrix<Fad<double>_> local_6a0;
  TPZManVector<Fad<double>,_3> xqsi;
  TPZFNMatrix<9,_Fad<double>_> DphivDx;
  TPZFNMatrix<3,_Fad<double>_> v;
  TPZFNMatrix<3,_Fad<double>_> gradphi;
  TPZFNMatrix<6,_Fad<double>_> dxdqsi;
  
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow &
       0xffffffff00000000;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&xqsi,3,(Fad<double> *)&gradv);
  Fad<double>::~Fad((Fad<double> *)&gradv);
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow &
       0xffffffff00000000;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&xqsiLxc,3,(Fad<double> *)&gradv);
  Fad<double>::~Fad((Fad<double> *)&gradv);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoQuad> *)this,coord,param,&xqsi.super_TPZVec<Fad<double>_>);
  norm.val_ = 0.0;
  norm.dx_.num_elts = 0;
  norm.dx_.ptr_to_data = (double *)0x0;
  norm.defaultVal = 0.0;
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable =
         (_func_int **)((long)&(xqsi.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2);
    gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         *(int64_t *)(*(long *)(this + 0xa90) + lVar3 * 8);
    gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
    Fad<double>::operator=
              ((Fad<double> *)((long)&(xqsiLxc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2),
               (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)&gradv);
    gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable =
         (_func_int **)((long)&(xqsiLxc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2);
    gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         (int64_t)gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
    Fad<double>::operator+=(&norm,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&gradv);
    lVar2 = lVar2 + 0x20;
  }
  sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&gradv,&norm);
  Fad<double>::operator=(&norm,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)&gradv);
  Fad<double>::~Fad((Fad<double> *)
                    &gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                     super_TPZBaseMatrix.fRow);
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow &
       0xffffffff00000000;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix(&dxdqsi,3,2,(Fad<double> *)&gradv);
  Fad<double>::~Fad((Fad<double> *)&gradv);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::GradX<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoQuad> *)this,coord,param,
             &dxdqsi.super_TPZFMatrix<Fad<double>_>);
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow &
       0xffffffff00000000;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&gradphi,3,1,(Fad<double> *)&gradv);
  Fad<double>::~Fad((Fad<double> *)&gradv);
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow &
       0xffffffff00000000;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&v,3,1,(Fad<double> *)&gradv);
  Fad<double>::~Fad((Fad<double> *)&gradv);
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)param->fStore;
  gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       (int64_t)gradv.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
            (&zero,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&gradv);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&gradv,3,3,&zero);
  DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       0x3ff0000000000000;
  DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._24_8_ =
       &norm;
  Fad<double>::Fad<FadBinaryDiv<FadCst<double>,Fad<double>>>
            (&phi,(FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)&DphivDx);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable =
         (_func_int **)((long)&(xqsiLxc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3);
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         *(int64_t *)(this + 0xa80);
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
         0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&v.super_TPZFMatrix<Fad<double>_>,lVar2,0);
    Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)&DphivDx);
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         *(int64_t *)(this + 0xa80);
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
         0;
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._24_8_
         = &zero;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&gradv.super_TPZFMatrix<Fad<double>_>,lVar2,lVar2)
    ;
    Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&DphivDx);
    local_6a0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&local_730;
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         0x3ff0000000000000;
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
         0;
    DphivDx.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._24_8_
         = &local_6a0;
    local_a10._8_8_ = (long)&(xqsiLxc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3;
    local_a10._0_8_ = &local_a98;
    local_a98.fadexpr_.expr_ =
         (FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
          )(FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
            *)&DphivDx;
    local_730.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&norm;
    local_730.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&norm;
    local_6a0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&norm;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&gradphi.super_TPZFMatrix<Fad<double>_>,lVar2,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                       *)local_a10);
    lVar3 = lVar3 + 0x20;
  }
  vec2 = (TPZFMatrix<Fad<double>_> *)local_a10;
  local_a10._0_8_ =
       (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
        *)0x0;
  local_a10._8_8_ = local_a10._8_8_ & 0xffffffff00000000;
  local_a10._16_8_ = (double *)0x0;
  local_a10._24_8_ = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&DphivDx,3,3,(Fad<double> *)vec2);
  Fad<double>::~Fad((Fad<double> *)local_a10);
  TensorProd<Fad<double>>
            (&local_6a0,(TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>> *)&v,
             &gradphi.super_TPZFMatrix<Fad<double>_>,vec2);
  Fad<double>::Fad(&local_a50,&phi);
  ::operator*(&local_730,&local_a50,&gradv.super_TPZFMatrix<Fad<double>_>);
  TPZFMatrix<Fad<double>_>::operator+((TPZFMatrix<Fad<double>_> *)local_a10,&local_6a0,&local_730);
  TPZFMatrix<Fad<double>_>::operator=
            (&DphivDx.super_TPZFMatrix<Fad<double>_>,(TPZFMatrix<Fad<double>_> *)local_a10);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_a10);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_730);
  Fad<double>::~Fad(&local_a50);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_6a0);
  TPZMatrix<Fad<double>_>::Multiply
            ((TPZMatrix<Fad<double>_> *)&DphivDx,&dxdqsi.super_TPZFMatrix<Fad<double>_>,gradx,0);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&DphivDx);
  Fad<double>::~Fad(&phi);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&gradv);
  Fad<double>::~Fad(&zero);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&v);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&gradphi);
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix(&dxdqsi);
  Fad<double>::~Fad(&norm);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xqsiLxc);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xqsi);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &param, TPZFMatrix<T> &gradx) const
        {
            // will first do dxdqsi and then d(phi*v)/dx, finaly d(phi*v)/dx * dxdqsi, where phi = 1/norm(xqsi - xc) and v = (xqsi - xc) * fR
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,param,xqsi); // gives the map (qsi,eta) to (x,y,z)
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            TPZFNMatrix<6,T> dxdqsi(3,2,0.); // But it is a (3,2) matrix. It is set (3,3) because of the later products
            GeomQuad::GradX(coord,param,dxdqsi);
            
            TPZFNMatrix<3,T> gradphi(3,1,0.), v(3,1,0.); // here phi = 1/norm(xqsi - xc) and v = (xqsi - xc) * fR
            T zero = param[0]-param[0];
            TPZFNMatrix<9,T> gradv(3,3,zero); // here v = (xqsi - xc) * fR
            T phi = 1./norm;
            
            for (int i = 0; i < 3; i++) {
                v(i,0) = xqsiLxc[i] * fR;
                gradv(i,i) = fR+zero;
                gradphi(i,0) = - (1. / (norm*norm*norm) ) * xqsiLxc[i];
            }
            
            TPZFNMatrix <9,T> DphivDx(3,3,0.); // will store d(phi*v)/dx
            DphivDx = TensorProd(v,gradphi) + phi*gradv;
            
            DphivDx.Multiply(dxdqsi, gradx);
        }